

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferMalloc.cpp
# Opt level: O1

void __thiscall adios2::format::BufferMalloc::Resize(BufferMalloc *this,size_t size,string *hint)

{
  bool bVar1;
  char cVar2;
  char *pcVar3;
  long *plVar4;
  size_t sVar5;
  long *plVar6;
  size_type *psVar7;
  char cVar8;
  char *local_110;
  uint local_108;
  char local_100 [16];
  string local_f0;
  string local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  string local_50;
  
  if (size != 0) {
    if (this->m_size == 0) {
      pcVar3 = (char *)malloc(size);
      this->m_buffer = pcVar3;
      if (pcVar3 == (char *)0x0) {
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Toolkit::Format","");
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f0,"buffer::heap::BufferMalloc","");
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"BufferSystemV","");
        cVar8 = '\x01';
        if (9 < size) {
          sVar5 = size;
          cVar2 = '\x04';
          do {
            cVar8 = cVar2;
            if (sVar5 < 100) {
              cVar8 = cVar8 + -2;
              goto LAB_004af559;
            }
            if (sVar5 < 1000) {
              cVar8 = cVar8 + -1;
              goto LAB_004af559;
            }
            if (sVar5 < 10000) goto LAB_004af559;
            bVar1 = 99999 < sVar5;
            sVar5 = sVar5 / 10000;
            cVar2 = cVar8 + '\x04';
          } while (bVar1);
          cVar8 = cVar8 + '\x01';
        }
LAB_004af559:
        local_110 = local_100;
        std::__cxx11::string::_M_construct((ulong)&local_110,cVar8);
        std::__detail::__to_chars_10_impl<unsigned_long>(local_110,local_108,size);
        plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,0x74d049);
        plVar6 = plVar4 + 2;
        if ((long *)*plVar4 == plVar6) {
          local_a0 = *plVar6;
          lStack_98 = plVar4[3];
          local_b0 = &local_a0;
        }
        else {
          local_a0 = *plVar6;
          local_b0 = (long *)*plVar4;
        }
        local_a8 = plVar4[1];
        *plVar4 = (long)plVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_b0);
        plVar6 = plVar4 + 2;
        if ((long *)*plVar4 == plVar6) {
          local_80 = *plVar6;
          lStack_78 = plVar4[3];
          local_90 = &local_80;
        }
        else {
          local_80 = *plVar6;
          local_90 = (long *)*plVar4;
        }
        local_88 = plVar4[1];
        *plVar4 = (long)plVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_90,(ulong)(hint->_M_dataplus)._M_p);
        psVar7 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_70.field_2._M_allocated_capacity = *psVar7;
          local_70.field_2._8_8_ = plVar4[3];
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        }
        else {
          local_70.field_2._M_allocated_capacity = *psVar7;
          local_70._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_70._M_string_length = plVar4[1];
        *plVar4 = (long)psVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        helper::ThrowNested<std::runtime_error>(&local_d0,&local_f0,&local_50,&local_70,-1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if (local_90 != &local_80) {
          operator_delete(local_90);
        }
        if (local_b0 != &local_a0) {
          operator_delete(local_b0);
        }
        if (local_110 != local_100) {
          operator_delete(local_110);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
      }
    }
    else {
      pcVar3 = (char *)realloc(this->m_buffer,size);
      if (pcVar3 == (char *)0x0) {
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Toolkit::Format","");
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f0,"buffer::heap::BufferMalloc","");
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"BufferSystemV","");
        cVar8 = '\x01';
        if (9 < size) {
          sVar5 = size;
          cVar2 = '\x04';
          do {
            cVar8 = cVar2;
            if (sVar5 < 100) {
              cVar8 = cVar8 + -2;
              goto LAB_004af33a;
            }
            if (sVar5 < 1000) {
              cVar8 = cVar8 + -1;
              goto LAB_004af33a;
            }
            if (sVar5 < 10000) goto LAB_004af33a;
            bVar1 = 99999 < sVar5;
            sVar5 = sVar5 / 10000;
            cVar2 = cVar8 + '\x04';
          } while (bVar1);
          cVar8 = cVar8 + '\x01';
        }
LAB_004af33a:
        local_110 = local_100;
        std::__cxx11::string::_M_construct((ulong)&local_110,cVar8);
        std::__detail::__to_chars_10_impl<unsigned_long>(local_110,local_108,size);
        plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,0x74d049);
        plVar6 = plVar4 + 2;
        if ((long *)*plVar4 == plVar6) {
          local_a0 = *plVar6;
          lStack_98 = plVar4[3];
          local_b0 = &local_a0;
        }
        else {
          local_a0 = *plVar6;
          local_b0 = (long *)*plVar4;
        }
        local_a8 = plVar4[1];
        *plVar4 = (long)plVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_b0);
        plVar6 = plVar4 + 2;
        if ((long *)*plVar4 == plVar6) {
          local_80 = *plVar6;
          lStack_78 = plVar4[3];
          local_90 = &local_80;
        }
        else {
          local_80 = *plVar6;
          local_90 = (long *)*plVar4;
        }
        local_88 = plVar4[1];
        *plVar4 = (long)plVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_90,(ulong)(hint->_M_dataplus)._M_p);
        psVar7 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_70.field_2._M_allocated_capacity = *psVar7;
          local_70.field_2._8_8_ = plVar4[3];
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        }
        else {
          local_70.field_2._M_allocated_capacity = *psVar7;
          local_70._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_70._M_string_length = plVar4[1];
        *plVar4 = (long)psVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        helper::ThrowNested<std::runtime_error>(&local_d0,&local_f0,&local_50,&local_70,-1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if (local_90 != &local_80) {
          operator_delete(local_90);
        }
        if (local_b0 != &local_a0) {
          operator_delete(local_b0);
        }
        if (local_110 != local_100) {
          operator_delete(local_110);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
      }
      this->m_buffer = pcVar3;
    }
    this->m_size = size;
  }
  return;
}

Assistant:

void BufferMalloc::Resize(const size_t size, const std::string hint)
{
    if (size == 0)
        return;
    if (m_size == 0)
    {
        m_buffer = (char *)malloc(size);
        if (m_buffer == NULL)
            helper::ThrowNested<std::runtime_error>(
                "Toolkit::Format", "buffer::heap::BufferMalloc", "BufferSystemV",
                "buffer overflow when resizing to " + std::to_string(size) + " bytes, " + hint);
    }
    else
    {
        char *tmp = (char *)realloc(m_buffer, size);
        if (tmp == NULL)
            helper::ThrowNested<std::runtime_error>(
                "Toolkit::Format", "buffer::heap::BufferMalloc", "BufferSystemV",
                "buffer overflow when resizing to " + std::to_string(size) + " bytes, " + hint);
        m_buffer = tmp;
    }
    m_size = size;
}